

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.cpp
# Opt level: O2

string * __thiscall ZXing::Error::location_abi_cxx11_(string *__return_storage_ptr__,Error *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  string local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string file;
  
  if (this->_file == (char *)0x0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&file,this->_file,(allocator<char> *)&local_a0);
    std::__cxx11::string::find_last_of((char *)&file,0x19a784);
    std::__cxx11::string::substr((ulong)&local_60,(ulong)&file);
    std::operator+(&local_a0,&local_60,":");
    std::__cxx11::to_string(&local_80,(int)this->_line);
    std::operator+(__return_storage_ptr__,&local_a0,&local_80);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&file);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Error::location() const
{
	if (!_file)
		return {};
	std::string file(_file);
	return file.substr(file.find_last_of("/\\") + 1) + ":" + std::to_string(_line);
}